

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void add_attribute_register
               (Context *ctx,RegisterType rtype,int regnum,MOJOSHADER_usage usage,int index,
               int writemask,int flags)

{
  RegisterList *pRVar1;
  
  pRVar1 = reglist_insert(ctx,&ctx->attributes,rtype,regnum);
  pRVar1->usage = usage;
  pRVar1->index = index;
  pRVar1->writemask = writemask;
  pRVar1->misc = flags;
  if (usage == MOJOSHADER_USAGE_POINTSIZE && (rtype ^ REG_TYPE_OUTPUT) == REG_TYPE_TEMP) {
    ctx->uses_pointsize = 1;
  }
  else if ((rtype ^ REG_TYPE_OUTPUT) == REG_TYPE_TEMP && usage == MOJOSHADER_USAGE_FOG) {
    ctx->uses_fog = 1;
  }
  return;
}

Assistant:

static void add_attribute_register(Context *ctx, const RegisterType rtype,
                                const int regnum, const MOJOSHADER_usage usage,
                                const int index, const int writemask, int flags)
{
    RegisterList *item = reglist_insert(ctx, &ctx->attributes, rtype, regnum);
    item->usage = usage;
    item->index = index;
    item->writemask = writemask;
    item->misc = flags;

    if ((rtype == REG_TYPE_OUTPUT) && (usage == MOJOSHADER_USAGE_POINTSIZE))
        ctx->uses_pointsize = 1;  // note that we have to check this later.
    else if ((rtype == REG_TYPE_OUTPUT) && (usage == MOJOSHADER_USAGE_FOG))
        ctx->uses_fog = 1;  // note that we have to check this later.
}